

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O2

void av1_count_colors_highbd
               (uint8_t *src8,int stride,int rows,int cols,int bit_depth,int *val_count,
               int *bin_val_count,int *num_color_bins,int *num_colors)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  uVar2 = 1 << ((byte)bit_depth & 0x1f);
  lVar9 = (long)src8 * 2;
  uVar8 = 0;
  memset(bin_val_count,0,0x400);
  if (val_count != (int *)0x0) {
    memset(val_count,0,(long)(int)uVar2 << 2);
  }
  uVar3 = (ulong)(uint)cols;
  if (cols < 1) {
    uVar3 = uVar8;
  }
  uVar7 = (ulong)(uint)rows;
  if (rows < 1) {
    uVar7 = uVar8;
  }
  for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      uVar1 = *(ushort *)(lVar9 + uVar5 * 2);
      uVar6 = (uint)(uVar1 >> ((byte)bit_depth - 8 & 0x1f));
      if (uVar6 < 0x100) {
        bin_val_count[uVar6] = bin_val_count[uVar6] + 1;
        if (val_count != (int *)0x0) {
          val_count[uVar1] = val_count[uVar1] + 1;
        }
      }
    }
    lVar9 = lVar9 + (long)stride * 2;
  }
  iVar4 = 0;
  for (lVar9 = 0; lVar9 != 0x100; lVar9 = lVar9 + 1) {
    iVar4 = (iVar4 + 1) - (uint)(bin_val_count[lVar9] == 0);
  }
  *num_color_bins = iVar4;
  if (val_count != (int *)0x0) {
    uVar3 = 0;
    uVar8 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar8 = uVar3;
    }
    iVar4 = 0;
    for (; uVar8 != uVar3; uVar3 = uVar3 + 1) {
      iVar4 = (iVar4 + 1) - (uint)(val_count[uVar3] == 0);
    }
    *num_colors = iVar4;
  }
  return;
}

Assistant:

void av1_count_colors_highbd(const uint8_t *src8, int stride, int rows,
                             int cols, int bit_depth, int *val_count,
                             int *bin_val_count, int *num_color_bins,
                             int *num_colors) {
  assert(bit_depth <= 12);
  const int max_bin_val = 1 << 8;
  const int max_pix_val = 1 << bit_depth;
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  memset(bin_val_count, 0, max_bin_val * sizeof(val_count[0]));
  if (val_count != NULL)
    memset(val_count, 0, max_pix_val * sizeof(val_count[0]));
  for (int r = 0; r < rows; ++r) {
    for (int c = 0; c < cols; ++c) {
      /*
       * Down-convert the pixels to 8-bit domain before counting.
       * This provides consistency of behavior for palette search
       * between lbd and hbd encodes. This down-converted pixels
       * are only used for calculating the threshold (n).
       */
      const int this_val = ((src[r * stride + c]) >> (bit_depth - 8));
      assert(this_val < max_bin_val);
      if (this_val >= max_bin_val) continue;
      ++bin_val_count[this_val];
      if (val_count != NULL) ++val_count[(src[r * stride + c])];
    }
  }
  int n = 0;
  // Count the colors based on 8-bit domain used to gate the palette path
  for (int i = 0; i < max_bin_val; ++i) {
    if (bin_val_count[i]) ++n;
  }
  *num_color_bins = n;

  // Count the actual hbd colors used to create top_colors
  n = 0;
  if (val_count != NULL) {
    for (int i = 0; i < max_pix_val; ++i) {
      if (val_count[i]) ++n;
    }
    *num_colors = n;
  }
}